

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int decodeFlags(MemPage *pPage,int flagByte)

{
  long lVar1;
  int iVar2;
  int in_ESI;
  long in_RDI;
  BtShared *pBt;
  
  lVar1 = *(long *)(in_RDI + 0x48);
  *(undefined1 *)(in_RDI + 0xb) = *(undefined1 *)(lVar1 + 0x25);
  if (in_ESI < 10) {
    *(undefined1 *)(in_RDI + 10) = 4;
    *(undefined1 *)(in_RDI + 8) = 0;
    if (in_ESI == 2) {
      *(undefined1 *)(in_RDI + 1) = 0;
      *(undefined1 *)(in_RDI + 2) = 0;
      *(code **)(in_RDI + 0x78) = cellSizePtr;
      *(code **)(in_RDI + 0x80) = btreeParseCellPtrIndex;
      *(undefined2 *)(in_RDI + 0xe) = *(undefined2 *)(lVar1 + 0x2a);
      *(undefined2 *)(in_RDI + 0x10) = *(undefined2 *)(lVar1 + 0x2c);
    }
    else {
      if (in_ESI != 5) {
        *(undefined1 *)(in_RDI + 1) = 0;
        *(undefined1 *)(in_RDI + 2) = 0;
        *(code **)(in_RDI + 0x78) = cellSizePtr;
        *(code **)(in_RDI + 0x80) = btreeParseCellPtrIndex;
        iVar2 = sqlite3CorruptError(0);
        return iVar2;
      }
      *(undefined1 *)(in_RDI + 2) = 0;
      *(code **)(in_RDI + 0x78) = cellSizePtrNoPayload;
      *(code **)(in_RDI + 0x80) = btreeParseCellPtrNoPayload;
      *(undefined1 *)(in_RDI + 1) = 1;
      *(undefined2 *)(in_RDI + 0xe) = *(undefined2 *)(lVar1 + 0x2e);
      *(undefined2 *)(in_RDI + 0x10) = *(undefined2 *)(lVar1 + 0x30);
    }
  }
  else {
    *(undefined1 *)(in_RDI + 10) = 0;
    *(undefined1 *)(in_RDI + 8) = 1;
    if (in_ESI == 0xd) {
      *(undefined1 *)(in_RDI + 2) = 1;
      *(code **)(in_RDI + 0x78) = cellSizePtrTableLeaf;
      *(code **)(in_RDI + 0x80) = btreeParseCellPtr;
      *(undefined1 *)(in_RDI + 1) = 1;
      *(undefined2 *)(in_RDI + 0xe) = *(undefined2 *)(lVar1 + 0x2e);
      *(undefined2 *)(in_RDI + 0x10) = *(undefined2 *)(lVar1 + 0x30);
    }
    else {
      if (in_ESI != 10) {
        *(undefined1 *)(in_RDI + 1) = 0;
        *(undefined1 *)(in_RDI + 2) = 0;
        *(code **)(in_RDI + 0x78) = cellSizePtrIdxLeaf;
        *(code **)(in_RDI + 0x80) = btreeParseCellPtrIndex;
        iVar2 = sqlite3CorruptError(0);
        return iVar2;
      }
      *(undefined1 *)(in_RDI + 1) = 0;
      *(undefined1 *)(in_RDI + 2) = 0;
      *(code **)(in_RDI + 0x78) = cellSizePtrIdxLeaf;
      *(code **)(in_RDI + 0x80) = btreeParseCellPtrIndex;
      *(undefined2 *)(in_RDI + 0xe) = *(undefined2 *)(lVar1 + 0x2a);
      *(undefined2 *)(in_RDI + 0x10) = *(undefined2 *)(lVar1 + 0x2c);
    }
  }
  return 0;
}

Assistant:

static int decodeFlags(MemPage *pPage, int flagByte){
  BtShared *pBt;     /* A copy of pPage->pBt */

  assert( pPage->hdrOffset==(pPage->pgno==1 ? 100 : 0) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  pBt = pPage->pBt;
  pPage->max1bytePayload = pBt->max1bytePayload;
  if( flagByte>=(PTF_ZERODATA | PTF_LEAF) ){
    pPage->childPtrSize = 0;
    pPage->leaf = 1;
    if( flagByte==(PTF_LEAFDATA | PTF_INTKEY | PTF_LEAF) ){
      pPage->intKeyLeaf = 1;
      pPage->xCellSize = cellSizePtrTableLeaf;
      pPage->xParseCell = btreeParseCellPtr;
      pPage->intKey = 1;
      pPage->maxLocal = pBt->maxLeaf;
      pPage->minLocal = pBt->minLeaf;
    }else if( flagByte==(PTF_ZERODATA | PTF_LEAF) ){
      pPage->intKey = 0;
      pPage->intKeyLeaf = 0;
      pPage->xCellSize = cellSizePtrIdxLeaf;
      pPage->xParseCell = btreeParseCellPtrIndex;
      pPage->maxLocal = pBt->maxLocal;
      pPage->minLocal = pBt->minLocal;
    }else{
      pPage->intKey = 0;
      pPage->intKeyLeaf = 0;
      pPage->xCellSize = cellSizePtrIdxLeaf;
      pPage->xParseCell = btreeParseCellPtrIndex;
      return SQLITE_CORRUPT_PAGE(pPage);
    }
  }else{
    pPage->childPtrSize = 4;
    pPage->leaf = 0;
    if( flagByte==(PTF_ZERODATA) ){
      pPage->intKey = 0;
      pPage->intKeyLeaf = 0;
      pPage->xCellSize = cellSizePtr;
      pPage->xParseCell = btreeParseCellPtrIndex;
      pPage->maxLocal = pBt->maxLocal;
      pPage->minLocal = pBt->minLocal;
    }else if( flagByte==(PTF_LEAFDATA | PTF_INTKEY) ){
      pPage->intKeyLeaf = 0;
      pPage->xCellSize = cellSizePtrNoPayload;
      pPage->xParseCell = btreeParseCellPtrNoPayload;
      pPage->intKey = 1;
      pPage->maxLocal = pBt->maxLeaf;
      pPage->minLocal = pBt->minLeaf;
    }else{
      pPage->intKey = 0;
      pPage->intKeyLeaf = 0;
      pPage->xCellSize = cellSizePtr;
      pPage->xParseCell = btreeParseCellPtrIndex;
      return SQLITE_CORRUPT_PAGE(pPage);
    }
  }
  return SQLITE_OK;
}